

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M68KDisassembler.c
# Opt level: O0

void d68020_cpdbcc(m68k_info *info)

{
  uint opcode;
  uint count;
  int iVar1;
  cs_m68k *pcVar2;
  m68k_info *in_RDI;
  uint ext2;
  uint ext1;
  cs_m68k_op *op1;
  cs_m68k_op *op0;
  cs_m68k *ext;
  m68k_info *in_stack_ffffffffffffffd0;
  cs_m68k_op *op;
  m68k_info *in_stack_ffffffffffffffe0;
  
  if ((in_RDI->type & 0x1c) == 0) {
    d68000_invalid((m68k_info *)0x384a93);
  }
  else {
    opcode = read_imm_16(in_stack_ffffffffffffffd0);
    count = read_imm_16(in_stack_ffffffffffffffd0);
    in_RDI->inst->Opcode = (opcode & 0x2f) + in_RDI->inst->Opcode;
    pcVar2 = build_init_op(in_stack_ffffffffffffffe0,opcode,count,
                           (int)((ulong)in_stack_ffffffffffffffd0 >> 0x20));
    op = pcVar2->operands + 1;
    pcVar2->operands[0].field_0.reg = (in_RDI->ir & 7) + M68K_REG_D0;
    iVar1 = make_int_16(count);
    make_cpbcc_operand(op,2,iVar1 + 2);
    set_insn_group(in_RDI,M68K_GRP_JUMP);
    set_insn_group(in_RDI,M68K_GRP_BRANCH_RELATIVE);
  }
  return;
}

Assistant:

static void d68020_cpdbcc(m68k_info *info)
{
	cs_m68k* ext;
	cs_m68k_op* op0;
	cs_m68k_op* op1;
	uint ext1, ext2;

	LIMIT_CPU_TYPES(info, M68020_PLUS);

	ext1 = read_imm_16(info);
	ext2 = read_imm_16(info);

	// these are all in row with the extension so just doing a add here is fine
	info->inst->Opcode += (ext1 & 0x2f);

	ext = build_init_op(info, M68K_INS_FDBF, 2, 0);
	op0 = &ext->operands[0];
	op1 = &ext->operands[1];

	op0->reg = M68K_REG_D0 + (info->ir & 7);

	make_cpbcc_operand(op1, M68K_OP_BR_DISP_SIZE_WORD, make_int_16(ext2) + 2);

	set_insn_group(info, M68K_GRP_JUMP);
	set_insn_group(info, M68K_GRP_BRANCH_RELATIVE);
}